

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDefinitionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddDefinitionsCommand::Clone(cmAddDefinitionsCommand *this)

{
  cmCommand *this_00;
  cmAddDefinitionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddDefinitionsCommand((cmAddDefinitionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddDefinitionsCommand; }